

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O1

void __thiscall
QOpenGLProgramBinaryCache::QOpenGLProgramBinaryCache(QOpenGLProgramBinaryCache *this)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined8 *puVar9;
  size_t sVar10;
  QString *pQVar11;
  long in_FS_OFFSET;
  QArrayData *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  QString local_c8;
  QString local_a8;
  QString local_88;
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 (*) [16])((long)&(this->m_currentCacheDir).d.ptr + 1) = (undefined1  [16])0x0;
  (this->m_currentCacheDir).d.d = (Data *)0x0;
  (this->m_currentCacheDir).d.ptr = (char16_t *)0x0;
  (this->m_localCacheDir).d.ptr = (char16_t *)0x0;
  (this->m_localCacheDir).d.size = 0;
  *(undefined1 (*) [16])&(this->m_globalCacheDir).d.size = (undefined1  [16])0x0;
  (this->m_globalCacheDir).d.d = (Data *)0x0;
  (this->m_globalCacheDir).d.ptr = (char16_t *)0x0;
  (this->m_memCache).chain.prev = &(this->m_memCache).chain;
  (this->m_memCache).chain.next = &(this->m_memCache).chain;
  (this->m_memCache).d.ref.atomic._q_value.super___atomic_base<int>._M_i = 1;
  (this->m_memCache).d.size = 0;
  (this->m_memCache).d.numBuckets = 0;
  (this->m_memCache).d.seed = 0;
  (this->m_memCache).d.spans = (Span *)0x0;
  (this->m_memCache).d.numBuckets = 0x80;
  puVar9 = (undefined8 *)operator_new__(0x98);
  *puVar9 = 1;
  puVar9[0x11] = 0;
  *(undefined2 *)(puVar9 + 0x12) = 0;
  *(undefined4 *)(puVar9 + 1) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0xc) = 0xffffffff;
  *(undefined4 *)(puVar9 + 2) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x14) = 0xffffffff;
  *(undefined4 *)(puVar9 + 3) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x1c) = 0xffffffff;
  *(undefined4 *)(puVar9 + 4) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x24) = 0xffffffff;
  *(undefined4 *)(puVar9 + 5) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x2c) = 0xffffffff;
  *(undefined4 *)(puVar9 + 6) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x34) = 0xffffffff;
  *(undefined4 *)(puVar9 + 7) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x3c) = 0xffffffff;
  *(undefined4 *)(puVar9 + 8) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x44) = 0xffffffff;
  *(undefined4 *)(puVar9 + 9) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x4c) = 0xffffffff;
  *(undefined4 *)(puVar9 + 10) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x54) = 0xffffffff;
  *(undefined4 *)(puVar9 + 0xb) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x5c) = 0xffffffff;
  *(undefined4 *)(puVar9 + 0xc) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 100) = 0xffffffff;
  *(undefined4 *)(puVar9 + 0xd) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x6c) = 0xffffffff;
  *(undefined4 *)(puVar9 + 0xe) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x74) = 0xffffffff;
  *(undefined4 *)(puVar9 + 0xf) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x7c) = 0xffffffff;
  *(undefined4 *)(puVar9 + 0x10) = 0xffffffff;
  *(undefined4 *)((long)puVar9 + 0x84) = 0xffffffff;
  (this->m_memCache).d.spans = (Span *)(puVar9 + 1);
  sVar10 = QHashSeed::globalSeed();
  (this->m_memCache).d.seed = sVar10;
  (this->m_memCache).mx = 100;
  *(undefined1 (*) [16])&(this->m_memCache).total = (undefined1  [16])0x0;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QSysInfo::buildAbi();
  local_68.a.b.d.size = local_a8.d.size;
  local_68.a.b.d.ptr = local_a8.d.ptr;
  pDVar4 = local_a8.d.d;
  local_a8.d.size = 0;
  local_68.a.a.m_size._0_4_ = 0xf;
  local_68.a.a.m_size._4_4_ = 0;
  local_68.a.a.m_data._0_4_ = 0x6c5a64;
  local_68.a.a.m_data._4_4_ = 0;
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  local_68.a.b.d.d._0_4_ = SUB84(pDVar4,0);
  local_68.a.b.d.d._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
  local_68.b = L'/';
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::convertTo<QString>
            (&local_88,&local_68);
  piVar5 = (int *)CONCAT44(local_68.a.b.d.d._4_4_,local_68.a.b.d.d._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.a.b.d.d._4_4_,local_68.a.b.d.d._0_4_),2,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QStandardPaths::writableLocation((StandardLocation)&local_a8);
  local_c8.d.d = (Data *)&local_a8;
  local_c8.d.ptr = (char16_t *)&local_88;
  QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
            ((QString *)&local_68,(QStringBuilder<const_QString_&,_const_QString_&> *)&local_c8);
  pQVar1 = &((this->m_globalCacheDir).d.d)->super_QArrayData;
  pcVar2 = (this->m_globalCacheDir).d.ptr;
  pDVar4 = (Data *)CONCAT44(local_68.a.a.m_size._4_4_,(undefined4)local_68.a.a.m_size);
  local_68.a.a.m_size._0_4_ = SUB84(pQVar1,0);
  local_68.a.a.m_size._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
  (this->m_globalCacheDir).d.d = pDVar4;
  (this->m_globalCacheDir).d.ptr =
       (char16_t *)CONCAT44(local_68.a.a.m_data._4_4_,local_68.a.a.m_data._0_4_);
  local_68.a.a.m_data._0_4_ = SUB84(pcVar2,0);
  local_68.a.a.m_data._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
  qVar3 = (this->m_globalCacheDir).d.size;
  (this->m_globalCacheDir).d.size = CONCAT44(local_68.a.b.d.d._4_4_,local_68.a.b.d.d._0_4_);
  local_68.a.b.d.d._0_4_ = (undefined4)qVar3;
  local_68.a.b.d.d._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  QStandardPaths::writableLocation((StandardLocation)&local_e8);
  uVar7 = local_d8;
  uVar6 = uStack_e0;
  pQVar1 = local_e8;
  local_e8 = (QArrayData *)0x0;
  uStack_e0 = 0;
  local_68.a.a.m_size._0_4_ = SUB84(pQVar1,0);
  local_68.a.a.m_size._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
  local_68.a.a.m_data._0_4_ = (undefined4)uVar6;
  local_68.a.a.m_data._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
  local_d8 = 0;
  local_68.a.b.d.d._0_4_ = (undefined4)uVar7;
  local_68.a.b.d.d._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  local_68.a.b.d.ptr = (char16_t *)&local_88;
  QStringBuilder<QString,_const_QString_&>::convertTo<QString>
            (&local_c8,(QStringBuilder<QString,_const_QString_&> *)&local_68);
  pQVar1 = &((this->m_localCacheDir).d.d)->super_QArrayData;
  pQVar11 = (QString *)(this->m_localCacheDir).d.ptr;
  (this->m_localCacheDir).d.d = local_c8.d.d;
  (this->m_localCacheDir).d.ptr = local_c8.d.ptr;
  qVar3 = (this->m_localCacheDir).d.size;
  (this->m_localCacheDir).d.size = local_c8.d.size;
  local_c8.d.d = (Data *)pQVar1;
  local_c8.d.ptr = (char16_t *)pQVar11;
  local_c8.d.size = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  piVar5 = (int *)CONCAT44(local_68.a.a.m_size._4_4_,(undefined4)local_68.a.a.m_size);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.a.a.m_size._4_4_,(undefined4)local_68.a.a.m_size),2
                 ,0x10);
    }
  }
  if (local_e8 != (QArrayData *)0x0) {
    LOCK();
    (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_e8,2,0x10);
    }
  }
  pQVar11 = &this->m_currentCacheDir;
  if ((undefined1 *)local_a8.d.size != (undefined1 *)0x0) {
    QString::operator=(pQVar11,&this->m_globalCacheDir);
    bVar8 = qt_ensureWritableDir(pQVar11);
    this->m_cacheWritable = bVar8;
  }
  if (this->m_cacheWritable == false) {
    QString::operator=(pQVar11,&this->m_localCacheDir);
    bVar8 = qt_ensureWritableDir(pQVar11);
    this->m_cacheWritable = bVar8;
  }
  QtPrivateLogging::lcOpenGLProgramDiskCache();
  if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
             _q_value._M_base._M_i & 1) != 0) {
    local_68.a.a.m_size._0_4_ = 2;
    local_68.a.a.m_size._4_4_ = 0;
    local_68.a.a.m_data._0_4_ = 0;
    local_68.a.a.m_data._4_4_ = 0;
    local_68.a.b.d.d._0_4_ = 0;
    local_68.a.b.d.d._4_4_ = 0;
    local_68.a.b.d.ptr = (char16_t *)QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
    QString::toLocal8Bit_helper((QChar *)&local_c8,(longlong)(this->m_currentCacheDir).d.ptr);
    pQVar11 = (QString *)local_c8.d.ptr;
    if ((QString *)local_c8.d.ptr == (QString *)0x0) {
      pQVar11 = (QString *)&QByteArray::_empty;
    }
    QMessageLogger::debug
              ((char *)&local_68,"Cache location \'%s\' writable = %d",pQVar11,
               (ulong)this->m_cacheWritable);
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLProgramBinaryCache::QOpenGLProgramBinaryCache()
    : m_cacheWritable(false)
{
    const QString subPath = "/qtshadercache-"_L1 + QSysInfo::buildAbi() + u'/';
    const QString sharedCachePath = QStandardPaths::writableLocation(QStandardPaths::GenericCacheLocation);
    m_globalCacheDir = sharedCachePath + subPath;
    m_localCacheDir = QStandardPaths::writableLocation(QStandardPaths::CacheLocation) + subPath;

    if (!sharedCachePath.isEmpty()) {
        m_currentCacheDir = m_globalCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
    }
    if (!m_cacheWritable) {
        m_currentCacheDir = m_localCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
    }

    qCDebug(lcOpenGLProgramDiskCache, "Cache location '%s' writable = %d", qPrintable(m_currentCacheDir), m_cacheWritable);
}